

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall Catch::RunContext::sectionEnded(RunContext *this,SectionEndInfo *endInfo)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer *pppIVar2;
  pointer ppIVar3;
  IEventListener *pIVar4;
  pointer pSVar5;
  pointer pSVar6;
  pointer this_00;
  Counts diff;
  Counts local_a8;
  size_type *local_88;
  size_type local_80;
  size_type local_78;
  undefined8 uStack_70;
  char *local_68;
  size_t sStack_60;
  uint64_t local_58;
  uint64_t uStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  double local_38;
  undefined1 local_30;
  
  local_a8.passed = (this->m_totals).assertions.passed - (endInfo->prevAssertions).passed;
  local_a8.failed = (this->m_totals).assertions.failed - (endInfo->prevAssertions).failed;
  local_a8.failedButOk =
       (this->m_totals).assertions.failedButOk - (endInfo->prevAssertions).failedButOk;
  local_a8.skipped = (this->m_totals).assertions.skipped - (endInfo->prevAssertions).skipped;
  local_30 = testForMissingAssertions(this,&local_a8);
  ppIVar3 = (this->m_activeSections).
            super__Vector_base<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->m_activeSections).
      super__Vector_base<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
      ._M_impl.super__Vector_impl_data._M_start != ppIVar3) {
    (*ppIVar3[-1]->_vptr_ITracker[3])();
    pppIVar2 = &(this->m_activeSections).
                super__Vector_base<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppIVar2 = *pppIVar2 + -1;
  }
  pIVar4 = (this->m_reporter).m_ptr;
  if (pIVar4 == (IEventListener *)0x0) {
    __assert_fail("m_ptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                  ,0x385,
                  "T *Catch::Detail::unique_ptr<Catch::IEventListener>::operator->() [T = Catch::IEventListener]"
                 );
  }
  local_38 = endInfo->durationInSeconds;
  local_88 = (size_type *)(endInfo->sectionInfo).name._M_dataplus._M_p;
  paVar1 = &(endInfo->sectionInfo).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88 == paVar1) {
    local_78 = paVar1->_M_allocated_capacity;
    uStack_70 = *(undefined8 *)((long)&(endInfo->sectionInfo).name.field_2 + 8);
    local_88 = &local_78;
  }
  else {
    local_78 = paVar1->_M_allocated_capacity;
  }
  local_80 = (endInfo->sectionInfo).name._M_string_length;
  (endInfo->sectionInfo).name._M_dataplus._M_p = (pointer)paVar1;
  (endInfo->sectionInfo).name._M_string_length = 0;
  (endInfo->sectionInfo).name.field_2._M_local_buf[0] = '\0';
  local_68 = (endInfo->sectionInfo).lineInfo.file;
  sStack_60 = (endInfo->sectionInfo).lineInfo.line;
  local_48 = (undefined4)local_a8.failedButOk;
  uStack_44 = local_a8.failedButOk._4_4_;
  uStack_40 = (undefined4)local_a8.skipped;
  uStack_3c = local_a8.skipped._4_4_;
  local_58 = local_a8.passed;
  uStack_50 = local_a8.failed;
  (*pIVar4->_vptr_IEventListener[0xe])();
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::_M_erase_at_end
            (&this->m_messages,
             (this->m_messages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_start);
  pSVar5 = (this->m_messageScopes).
           super__Vector_base<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar6 = (this->m_messageScopes).
           super__Vector_base<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_00 = pSVar5;
  if (pSVar6 != pSVar5) {
    do {
      ScopedMessage::~ScopedMessage(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pSVar6);
    (this->m_messageScopes).
    super__Vector_base<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>._M_impl.
    super__Vector_impl_data._M_finish = pSVar5;
  }
  return;
}

Assistant:

void RunContext::sectionEnded(SectionEndInfo&& endInfo) {
        Counts assertions = m_totals.assertions - endInfo.prevAssertions;
        bool missingAssertions = testForMissingAssertions(assertions);

        if (!m_activeSections.empty()) {
            m_activeSections.back()->close();
            m_activeSections.pop_back();
        }

        m_reporter->sectionEnded(SectionStats(CATCH_MOVE(endInfo.sectionInfo), assertions, endInfo.durationInSeconds, missingAssertions));
        m_messages.clear();
        m_messageScopes.clear();
    }